

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

tHalfEdge __thiscall MeshLib::Solid::idHalfedge(Solid *this,int id0,int id1)

{
  HalfEdge *pHVar1;
  tEdge this_00;
  TopologyException *pTVar2;
  HalfEdge **ppHVar3;
  Vertex **ppVVar4;
  int *piVar5;
  tHalfEdge he;
  tEdge e;
  int id1_local;
  int id0_local;
  Solid *this_local;
  
  this_00 = idEdge(this,id0,id1);
  if (this_00 == (tEdge)0x0) {
    pTVar2 = (TopologyException *)__cxa_allocate_exception(8);
    TopologyException::TopologyException(pTVar2);
    __cxa_throw(pTVar2,&TopologyException::typeinfo,TopologyException::~TopologyException);
  }
  ppHVar3 = Edge::halfedge(this_00,0);
  pHVar1 = *ppHVar3;
  ppVVar4 = HalfEdge::source(pHVar1);
  piVar5 = Vertex::id(*ppVVar4);
  if (*piVar5 == id0) {
    ppVVar4 = HalfEdge::target(pHVar1);
    piVar5 = Vertex::id(*ppVVar4);
    if (*piVar5 == id1) {
      return pHVar1;
    }
  }
  ppHVar3 = Edge::halfedge(this_00,1);
  pHVar1 = *ppHVar3;
  ppVVar4 = HalfEdge::source(pHVar1);
  piVar5 = Vertex::id(*ppVVar4);
  if (*piVar5 == id0) {
    ppVVar4 = HalfEdge::target(pHVar1);
    piVar5 = Vertex::id(*ppVVar4);
    if (*piVar5 == id1) {
      return pHVar1;
    }
  }
  pTVar2 = (TopologyException *)__cxa_allocate_exception(8);
  TopologyException::TopologyException(pTVar2);
  __cxa_throw(pTVar2,&TopologyException::typeinfo,TopologyException::~TopologyException);
}

Assistant:

Solid::tHalfEdge Solid::idHalfedge( int id0, int id1 )
{
	tEdge e = idEdge( id0, id1 );
	if(! e ) throw TopologyException();;
	tHalfEdge he = e->halfedge(0);
	if( he->source()->id() == id0 && he->target()->id() == id1 ) return he;
	he = e->halfedge(1);
	if( he->source()->id() != id0 || he->target()->id() != id1 ) throw TopologyException();
	return he;
}